

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O3

void cmAddLinkDirectoryForTarget(void *arg,char *tgt,char *d)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  cmTarget *this;
  long *plVar3;
  undefined8 *puVar4;
  long *plVar5;
  ulong *puVar6;
  ulong uVar7;
  allocator<char> local_10a;
  allocator<char> local_109;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_108;
  ulong *local_d8;
  long local_d0;
  ulong local_c8;
  long lStack_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  size_type local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  element_type *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_90;
  ulong *local_88;
  long local_80;
  ulong local_78 [2];
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48 [2];
  long local_38 [2];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,tgt,(allocator<char> *)&local_d8);
  this = cmMakefile::FindLocalNonAliasTarget((cmMakefile *)arg,&local_108.Value);
  paVar2 = &local_108.Value.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108.Value._M_dataplus._M_p != paVar2) {
    operator_delete(local_108.Value._M_dataplus._M_p,
                    local_108.Value.field_2._M_allocated_capacity + 1);
  }
  local_108.Value._M_dataplus._M_p = (pointer)paVar2;
  if (this != (cmTarget *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,d,(allocator<char> *)&local_d8);
    cmMakefile::GetBacktrace((cmMakefile *)arg);
    if (local_b8 == &local_a8) {
      local_108.Value.field_2._8_8_ = local_a8._8_8_;
    }
    else {
      local_108.Value._M_dataplus._M_p = (pointer)local_b8;
    }
    local_108.Value.field_2._M_allocated_capacity._1_7_ = local_a8._M_allocated_capacity._1_7_;
    local_108.Value.field_2._M_local_buf[0] = local_a8._M_local_buf[0];
    local_108.Value._M_string_length = local_b0;
    local_b0 = 0;
    local_a8._M_local_buf[0] = '\0';
    local_108.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = local_98;
    local_108.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = p_Stack_90;
    local_98 = (element_type *)0x0;
    p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_b8 = &local_a8;
    cmTarget::InsertLinkDirectory(this,&local_108,false);
    if (local_108.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_108.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                 TopEntry.
                 super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108.Value._M_dataplus._M_p != paVar2) {
      operator_delete(local_108.Value._M_dataplus._M_p,
                      local_108.Value.field_2._M_allocated_capacity + 1);
    }
    if (p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
    }
    if (local_b8 == &local_a8) {
      return;
    }
    local_38[0] = CONCAT71(local_a8._M_allocated_capacity._1_7_,local_a8._M_local_buf[0]);
    local_48[0] = local_b8;
    goto LAB_002a4c30;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)local_48,tgt,&local_109);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)local_48,0,(char *)0x0,0x7a3cd5);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_58 = *plVar5;
    lStack_50 = plVar3[3];
    local_68 = &local_58;
  }
  else {
    local_58 = *plVar5;
    local_68 = (long *)*plVar3;
  }
  local_60 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_68);
  puVar6 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar6) {
    local_c8 = *puVar6;
    lStack_c0 = plVar3[3];
    local_d8 = &local_c8;
  }
  else {
    local_c8 = *puVar6;
    local_d8 = (ulong *)*plVar3;
  }
  local_d0 = plVar3[1];
  *plVar3 = (long)puVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,d,&local_10a);
  uVar7 = 0xf;
  if (local_d8 != &local_c8) {
    uVar7 = local_c8;
  }
  if (uVar7 < (ulong)(local_80 + local_d0)) {
    uVar7 = 0xf;
    if (local_88 != local_78) {
      uVar7 = local_78[0];
    }
    if (uVar7 < (ulong)(local_80 + local_d0)) goto LAB_002a4b3f;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,(ulong)local_d8);
  }
  else {
LAB_002a4b3f:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_88);
  }
  psVar1 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_108.Value.field_2._M_allocated_capacity = *psVar1;
    local_108.Value.field_2._8_8_ = puVar4[3];
  }
  else {
    local_108.Value.field_2._M_allocated_capacity = *psVar1;
    local_108.Value._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_108.Value._M_string_length = puVar4[1];
  *puVar4 = psVar1;
  puVar4[1] = 0;
  *(undefined1 *)psVar1 = 0;
  cmSystemTools::Error(&local_108.Value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108.Value._M_dataplus._M_p != paVar2) {
    operator_delete(local_108.Value._M_dataplus._M_p,
                    local_108.Value.field_2._M_allocated_capacity + 1);
  }
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8,local_c8 + 1);
  }
  if (local_68 != &local_58) {
    operator_delete(local_68,local_58 + 1);
  }
  if (local_48[0] ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38) {
    return;
  }
LAB_002a4c30:
  operator_delete(local_48[0],local_38[0] + 1);
  return;
}

Assistant:

static void CCONV cmAddLinkDirectoryForTarget(void* arg, const char* tgt,
                                              const char* d)
{
  cmMakefile* mf = static_cast<cmMakefile*>(arg);
  cmTarget* t = mf->FindLocalNonAliasTarget(tgt);
  if (!t) {
    cmSystemTools::Error(
      "Attempt to add link directories to non-existent target: " +
      std::string(tgt) + " for directory " + std::string(d));
    return;
  }
  t->InsertLinkDirectory(BT<std::string>(d, mf->GetBacktrace()));
}